

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O3

void __thiscall
ktx::CommandDeflate::Options::process
          (Options *this,Options *param_1,ParseResult *args,Reporter *report)

{
  OptionValue *pOVar1;
  bool *pbVar2;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kQuiet,&local_41);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_40);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->quiet = *pbVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,kWarningsAsErrors,&local_41);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_40);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->warningsAsErrors = *pbVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((this->quiet == true) && (this->warningsAsErrors == true)) {
    Reporter::fatal_usage<char_const(&)[35],char_const*&,char_const*&>
              (report,(char (*) [35])"Cannot specify both --{} and --{}.",&kQuiet,&kWarningsAsErrors
              );
  }
  return;
}

Assistant:

void CommandDeflate::Options::process(cxxopts::Options&,
                                             cxxopts::ParseResult& args,
                                             Reporter& report) {
    quiet = args[kQuiet].as<bool>();
    warningsAsErrors = args[kWarningsAsErrors].as<bool>();
    if (quiet && warningsAsErrors) {
        report.fatal_usage("Cannot specify both --{} and --{}.",
                           this->kQuiet, this->kWarningsAsErrors);
    }
}